

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.cpp
# Opt level: O3

void lzham::lzham_lib_set_memory_callbacks
               (lzham_realloc_func pRealloc,lzham_msize_func pMSize,void *pUser_data)

{
  code *pcVar1;
  code *pcVar2;
  
  pcVar2 = lzham_default_realloc;
  if (pRealloc != (lzham_realloc_func)0x0 && pMSize != (lzham_msize_func)0x0) {
    pcVar2 = pRealloc;
  }
  pcVar1 = lzham_default_msize;
  g_pUser_data = (void *)0x0;
  if (pRealloc != (lzham_realloc_func)0x0 && pMSize != (lzham_msize_func)0x0) {
    g_pUser_data = pUser_data;
    pcVar1 = pMSize;
  }
  g_pRealloc = pcVar2;
  g_pMSize = pcVar1;
  return;
}

Assistant:

void LZHAM_CDECL lzham_lib_set_memory_callbacks(lzham_realloc_func pRealloc, lzham_msize_func pMSize, void* pUser_data)
   {
      if ((!pRealloc) || (!pMSize))
      {
         g_pRealloc = lzham_default_realloc;
         g_pMSize = lzham_default_msize;
         g_pUser_data = NULL;
      }
      else
      {
         g_pRealloc = pRealloc;
         g_pMSize = pMSize;
         g_pUser_data = pUser_data;
      }
   }